

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O1

double brcmp1(int *mu,double *a,double *b,double *x,double *y)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double local_48;
  
  brcmp1::a0 = *a;
  if (*b <= *a) {
    brcmp1::a0 = *b;
  }
  if (8.0 <= brcmp1::a0) {
    dVar2 = *a;
    dVar3 = *b;
    if (dVar2 <= dVar3) {
      dVar4 = dVar2 / dVar3 + 1.0;
      brcmp1::x0 = (dVar2 / dVar3) / dVar4;
      brcmp1::y0 = 1.0 / dVar4;
      brcmp1::lambda = dVar2 - (dVar2 + dVar3) * *x;
    }
    else {
      dVar4 = dVar3 / dVar2 + 1.0;
      brcmp1::x0 = 1.0 / dVar4;
      brcmp1::y0 = (dVar3 / dVar2) / dVar4;
      brcmp1::lambda = (dVar2 + dVar3) * *y - dVar3;
    }
    dVar2 = -brcmp1::lambda / dVar2;
    brcmp1::e = dVar2;
    if (ABS(dVar2) <= 0.6) {
      brcmp1::u = rlog1(&brcmp1::e);
    }
    else {
      dVar3 = log(*x / brcmp1::x0);
      brcmp1::u = dVar2 - dVar3;
    }
    dVar2 = brcmp1::lambda / *b;
    brcmp1::e = dVar2;
    if (ABS(dVar2) <= 0.6) {
      dVar2 = rlog1(&brcmp1::e);
    }
    else {
      dVar3 = log(*y / brcmp1::y0);
      dVar2 = dVar2 - dVar3;
    }
    brcmp1::T4 = -(*a * brcmp1::u + dVar2 * *b);
    brcmp1::z = esum(mu,&brcmp1::T4);
    dVar2 = *b * brcmp1::x0;
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    local_48 = dVar2 * 0.398942280401433 * brcmp1::z;
    dVar2 = bcorr(a,b);
    dVar2 = exp(-dVar2);
  }
  else {
    dVar2 = *x;
    if (dVar2 <= 0.375) {
      brcmp1::lnx = log(dVar2);
      brcmp1::T1 = -*x;
      brcmp1::lny = alnrel(&brcmp1::T1);
    }
    else {
      if (*y <= 0.375) {
        brcmp1::T2 = -*y;
        brcmp1::lnx = alnrel(&brcmp1::T2);
      }
      else {
        brcmp1::lnx = log(dVar2);
      }
      brcmp1::lny = log(*y);
    }
    brcmp1::z = *a * brcmp1::lnx + brcmp1::lny * *b;
    if (1.0 <= brcmp1::a0) {
      dVar2 = betaln(a,b);
      brcmp1::z = brcmp1::z - dVar2;
      dVar2 = esum(mu,&brcmp1::z);
      return dVar2;
    }
    brcmp1::b0 = *b;
    if (*b <= *a) {
      brcmp1::b0 = *a;
    }
    if (brcmp1::b0 < 8.0) {
      if (1.0 < brcmp1::b0) {
        brcmp1::u = gamln1(&brcmp1::a0);
        iVar1 = (int)(brcmp1::b0 + -1.0);
        if (0 < iVar1) {
          dVar2 = 1.0;
          do {
            brcmp1::b0 = brcmp1::b0 + -1.0;
            dVar2 = dVar2 * (brcmp1::b0 / (brcmp1::b0 + brcmp1::a0));
            iVar1 = iVar1 + -1;
          } while (iVar1 != 0);
          dVar2 = log(dVar2);
          brcmp1::u = dVar2 + brcmp1::u;
        }
        brcmp1::z = brcmp1::z - brcmp1::u;
        brcmp1::b0 = brcmp1::b0 + -1.0;
        brcmp1::apb = brcmp1::b0 + brcmp1::a0;
        if (brcmp1::apb <= 1.0) {
          dVar2 = gam1(&brcmp1::apb);
          brcmp1::t = dVar2 + 1.0;
        }
        else {
          brcmp1::u = brcmp1::apb + -1.0;
          dVar2 = gam1(&brcmp1::u);
          brcmp1::t = (dVar2 + 1.0) / brcmp1::apb;
        }
        dVar2 = brcmp1::a0;
        dVar3 = esum(mu,&brcmp1::z);
        dVar4 = gam1(&brcmp1::b0);
        return ((dVar4 + 1.0) * dVar3 * dVar2) / brcmp1::t;
      }
      dVar2 = esum(mu,&brcmp1::z);
      if ((dVar2 == 0.0) && (!NAN(dVar2))) {
        return dVar2;
      }
      brcmp1::apb = *a + *b;
      if (brcmp1::apb <= 1.0) {
        dVar3 = gam1(&brcmp1::apb);
        brcmp1::z = dVar3 + 1.0;
      }
      else {
        brcmp1::u = *a + *b + -1.0;
        dVar3 = gam1(&brcmp1::u);
        brcmp1::z = (dVar3 + 1.0) / brcmp1::apb;
      }
      dVar3 = gam1(a);
      dVar4 = gam1(b);
      return (dVar2 * (((dVar4 + 1.0) * (dVar3 + 1.0)) / brcmp1::z) * brcmp1::a0) /
             (brcmp1::a0 / brcmp1::b0 + 1.0);
    }
    dVar2 = gamln1(&brcmp1::a0);
    dVar3 = algdiv(&brcmp1::a0,&brcmp1::b0);
    brcmp1::u = dVar3 + dVar2;
    brcmp1::T3 = brcmp1::z - brcmp1::u;
    local_48 = brcmp1::a0;
    dVar2 = esum(mu,&brcmp1::T3);
  }
  return dVar2 * local_48;
}

Assistant:

double brcmp1(int *mu,double *a,double *b,double *x,double *y)
/*
-----------------------------------------------------------------------
          EVALUATION OF  EXP(MU) * (X**A*Y**B/BETA(A,B))
-----------------------------------------------------------------------
*/
{
static double Const = .398942280401433e0;
static double brcmp1,a0,apb,b0,c,e,h,lambda,lnx,lny,t,u,v,x0,y0,z;
static int i,n;
/*
-----------------
     CONST = 1/SQRT(2*PI)
-----------------
*/
static double T1,T2,T3,T4;
/*
     ..
     .. Executable Statements ..
*/
    a0 = fifdmin1(*a,*b);
    if(a0 >= 8.0e0) goto S130;
    if(*x > 0.375e0) goto S10;
    lnx = log(*x);
    T1 = -*x;
    lny = alnrel(&T1);
    goto S30;
S10:
    if(*y > 0.375e0) goto S20;
    T2 = -*y;
    lnx = alnrel(&T2);
    lny = log(*y);
    goto S30;
S20:
    lnx = log(*x);
    lny = log(*y);
S30:
    z = *a*lnx+*b*lny;
    if(a0 < 1.0e0) goto S40;
    z -= betaln(a,b);
    brcmp1 = esum(mu,&z);
    return brcmp1;
S40:
/*
-----------------------------------------------------------------------
              PROCEDURE FOR A .LT. 1 OR B .LT. 1
-----------------------------------------------------------------------
*/
    b0 = fifdmax1(*a,*b);
    if(b0 >= 8.0e0) goto S120;
    if(b0 > 1.0e0) goto S70;
/*
                   ALGORITHM FOR B0 .LE. 1
*/
    brcmp1 = esum(mu,&z);
    if(brcmp1 == 0.0e0) return brcmp1;
    apb = *a+*b;
    if(apb > 1.0e0) goto S50;
    z = 1.0e0+gam1(&apb);
    goto S60;
S50:
    u = *a+*b-1.e0;
    z = (1.0e0+gam1(&u))/apb;
S60:
    c = (1.0e0+gam1(a))*(1.0e0+gam1(b))/z;
    brcmp1 = brcmp1*(a0*c)/(1.0e0+a0/b0);
    return brcmp1;
S70:
/*
                ALGORITHM FOR 1 .LT. B0 .LT. 8
*/
    u = gamln1(&a0);
    n = b0-1.0e0;
    if(n < 1) goto S90;
    c = 1.0e0;
    for(i=1; i<=n; i++) {
        b0 -= 1.0e0;
        c *= (b0/(a0+b0));
    }
    u = log(c)+u;
S90:
    z -= u;
    b0 -= 1.0e0;
    apb = a0+b0;
    if(apb > 1.0e0) goto S100;
    t = 1.0e0+gam1(&apb);
    goto S110;
S100:
    u = a0+b0-1.e0;
    t = (1.0e0+gam1(&u))/apb;
S110:
    brcmp1 = a0*esum(mu,&z)*(1.0e0+gam1(&b0))/t;
    return brcmp1;
S120:
/*
                   ALGORITHM FOR B0 .GE. 8
*/
    u = gamln1(&a0)+algdiv(&a0,&b0);
    T3 = z-u;
    brcmp1 = a0*esum(mu,&T3);
    return brcmp1;
S130:
/*
-----------------------------------------------------------------------
              PROCEDURE FOR A .GE. 8 AND B .GE. 8
-----------------------------------------------------------------------
*/
    if(*a > *b) goto S140;
    h = *a/ *b;
    x0 = h/(1.0e0+h);
    y0 = 1.0e0/(1.0e0+h);
    lambda = *a-(*a+*b)**x;
    goto S150;
S140:
    h = *b/ *a;
    x0 = 1.0e0/(1.0e0+h);
    y0 = h/(1.0e0+h);
    lambda = (*a+*b)**y-*b;
S150:
    e = -(lambda/ *a);
    if(fabs(e) > 0.6e0) goto S160;
    u = rlog1(&e);
    goto S170;
S160:
    u = e-log(*x/x0);
S170:
    e = lambda/ *b;
    if(fabs(e) > 0.6e0) goto S180;
    v = rlog1(&e);
    goto S190;
S180:
    v = e-log(*y/y0);
S190:
    T4 = -(*a*u+*b*v);
    z = esum(mu,&T4);
    brcmp1 = Const*sqrt(*b*x0)*z*exp(-bcorr(a,b));
    return brcmp1;
}